

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::prepend_node(xml_node_struct *child,xml_node_struct *node)

{
  xml_node_struct *pxVar1;
  xml_node_struct **ppxVar2;
  
  child->parent = node;
  pxVar1 = node->first_child;
  if (pxVar1 == (xml_node_struct *)0x0) {
    ppxVar2 = &child->prev_sibling_c;
  }
  else {
    ppxVar2 = &pxVar1->prev_sibling_c;
    child->prev_sibling_c = pxVar1->prev_sibling_c;
  }
  *ppxVar2 = child;
  child->next_sibling = pxVar1;
  node->first_child = child;
  return;
}

Assistant:

inline void prepend_node(xml_node_struct* child, xml_node_struct* node)
	{
		child->parent = node;

		xml_node_struct* head = node->first_child;

		if (head)
		{
			child->prev_sibling_c = head->prev_sibling_c;
			head->prev_sibling_c = child;
		}
		else
			child->prev_sibling_c = child;

		child->next_sibling = head;
		node->first_child = child;
	}